

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithValue
          (CodeGenGenericContext *this,x86Reg reg,x86Argument arg)

{
  x86Argument *pxVar1;
  
  if (this->genRegRead[reg] == false) {
    if (this->x86Base[this->genRegUpdate[reg]].name != o_none) {
      this->x86Base[this->genRegUpdate[reg]].name = o_none;
      this->optimizationCount = this->optimizationCount + 1;
    }
  }
  this->genReg[reg].type = argNone;
  InvalidateDependand(this,reg);
  pxVar1 = this->genReg + reg;
  pxVar1->ptrBase = arg.ptrBase;
  pxVar1->ptrIndex = arg.ptrIndex;
  *(undefined8 *)(&pxVar1->ptrBase + 2) = arg._24_8_;
  pxVar1 = this->genReg + reg;
  pxVar1->type = arg.type;
  *(undefined4 *)&pxVar1->field_0x4 = arg._4_4_;
  pxVar1->field_1 = arg.field_1;
  this->genRegUpdate[reg] =
       (int)((ulong)((long)this->x86Op - (long)this->x86Base) >> 4) * -0x33333333;
  this->genRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithValue(x86Reg reg, x86Argument arg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	genReg[reg] = arg;
	genRegUpdate[reg] = unsigned(x86Op - x86Base);
	genRegRead[reg] = false;
}